

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_load.c
# Opt level: O0

int lua_loadx(lua_State *L,lua_Reader reader,void *data,char *chunkname,char *mode)

{
  int iVar1;
  char *in_RCX;
  long in_RDI;
  int status;
  LexState ls;
  undefined4 in_stack_ffffffffffffff18;
  undefined1 local_e0 [60];
  undefined4 local_a4;
  undefined4 local_a0;
  undefined4 local_9c;
  undefined4 local_98;
  LexState *local_70;
  long local_18;
  undefined4 *local_10;
  
  if ((LexState *)in_RCX == (LexState *)0x0) {
    in_RCX = "?";
  }
  local_10 = &local_a4;
  local_98 = (undefined4)in_RDI;
  local_a4 = 0;
  local_a0 = 0;
  local_9c = 0;
  local_70 = (LexState *)in_RCX;
  local_18 = in_RDI;
  iVar1 = lj_vm_cpcall(in_RDI,0,local_e0,cpparser);
  lj_lex_cleanup((lua_State *)CONCAT44(iVar1,in_stack_ffffffffffffff18),(LexState *)in_RCX);
  if (*(uint *)((ulong)*(uint *)(local_18 + 8) + 0x54) <=
      *(uint *)((ulong)*(uint *)(local_18 + 8) + 0x50)) {
    lj_gc_step((lua_State *)CONCAT44(iVar1,in_stack_ffffffffffffff18));
  }
  return iVar1;
}

Assistant:

LUA_API int lua_loadx(lua_State *L, lua_Reader reader, void *data,
		      const char *chunkname, const char *mode)
{
  LexState ls;
  int status;
  ls.rfunc = reader;
  ls.rdata = data;
  ls.chunkarg = chunkname ? chunkname : "?";
  ls.mode = mode;
  lj_buf_init(L, &ls.sb);
  status = lj_vm_cpcall(L, NULL, &ls, cpparser);
  lj_lex_cleanup(L, &ls);
  lj_gc_check(L);
  return status;
}